

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint32_t roaring_uint32_iterator_read(roaring_uint32_iterator_t *it,uint32_t *buf,uint32_t count)

{
  _Bool _Var1;
  byte bVar2;
  undefined8 in_RAX;
  uint uVar3;
  undefined2 uStack_38;
  uint16_t low16;
  uint32_t consumed;
  
  bVar2 = it->has_value;
  uVar3 = 0;
  _uStack_38 = in_RAX;
  while( true ) {
    if ((bVar2 & 1) == 0) {
      return uVar3;
    }
    if (count < uVar3 || count - uVar3 == 0) break;
    _uStack_38 = CONCAT22((short)it->current_value,uStack_38);
    _Var1 = container_iterator_read_into_uint32
                      (it->container,it->typecode,&it->container_it,it->highbits,buf,count - uVar3,
                       &consumed,&low16);
    uVar3 = uVar3 + consumed;
    if (_Var1) {
      it->has_value = true;
      it->current_value = (uint)low16 | it->highbits;
      return uVar3;
    }
    buf = buf + consumed;
    it->container_index = it->container_index + 1;
    bVar2 = loadfirstvalue(it);
    it->has_value = (_Bool)bVar2;
  }
  return uVar3;
}

Assistant:

uint32_t roaring_uint32_iterator_read(roaring_uint32_iterator_t *it,
                                      uint32_t *buf, uint32_t count) {
    uint32_t ret = 0;
    while (it->has_value && ret < count) {
        uint32_t consumed;
        uint16_t low16 = (uint16_t)it->current_value;
        bool has_value = container_iterator_read_into_uint32(
            it->container, it->typecode, &it->container_it, it->highbits, buf,
            count - ret, &consumed, &low16);
        ret += consumed;
        buf += consumed;
        if (has_value) {
            it->has_value = true;
            it->current_value = it->highbits | low16;
            assert(ret == count);
            return ret;
        }
        it->container_index++;
        it->has_value = loadfirstvalue(it);
    }
    return ret;
}